

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum32.c
# Opt level: O2

void Hacl_Bignum32_bn_to_bytes_le(uint32_t len,uint32_t *b,uint8_t *res)

{
  long lVar1;
  uint8_t *__dest;
  ulong uVar2;
  void *__s;
  undefined8 uStack_40;
  uint8_t *local_38;
  
  uVar2 = (ulong)((len - 1 & 0xfffffffc) + 4);
  lVar1 = -(uVar2 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar1);
  local_38 = res;
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x136193;
  memset(__s,0,uVar2);
  for (uVar2 = 0; __dest = local_38, (len - 1 >> 2) + 1 != uVar2; uVar2 = uVar2 + 1) {
    *(uint32_t *)((long)__s + uVar2 * 4) = b[uVar2];
  }
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1361b7;
  memcpy(__dest,__s,(ulong)len);
  return;
}

Assistant:

void Hacl_Bignum32_bn_to_bytes_le(uint32_t len, uint32_t *b, uint8_t *res)
{
  uint32_t bnLen = (len - 1U) / 4U + 1U;
  uint32_t tmpLen = 4U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < bnLen; i++)
  {
    store32_le(tmp + i * 4U, b[i]);
  }
  memcpy(res, tmp, len * sizeof (uint8_t));
}